

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindXor(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
                  Vec_Int_t **vUnatePairs,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint local_38;
  int n;
  int fVerbose_local;
  Vec_Int_t **vUnatePairs_local;
  Vec_Int_t *vBinateVars_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word **pSets_local;
  
  if (fVerbose != 0) {
    printf("  ");
  }
  for (local_38 = 0; (int)local_38 < 2; local_38 = local_38 + 1) {
    Vec_IntClear(vUnatePairs[(int)local_38]);
    Gia_ManFindXorInt(pSets[(int)local_38],pSets[(int)(uint)((local_38 != 0 ^ 0xffU) & 1)],
                      vBinateVars,vDivs,nWords,vUnatePairs[(int)local_38]);
    if (fVerbose != 0) {
      uVar1 = Vec_IntSize(vUnatePairs[(int)local_38]);
      printf("UX%d =%5d ",(ulong)local_38,(ulong)uVar1);
    }
  }
  iVar2 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],fVerbose);
  return iVar2;
}

Assistant:

int Gia_ManFindXor( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vUnatePairs[n] );
        Gia_ManFindXorInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UX%d =%5d ", n, Vec_IntSize(vUnatePairs[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
}